

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNodeSetAdd(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  long lVar4;
  long lVar5;
  char *extra;
  xmlNsPtr ns;
  
  if (val == (xmlNodePtr)0x0 || cur == (xmlNodeSetPtr)0x0) {
    return -1;
  }
  iVar1 = cur->nodeNr;
  lVar5 = (long)iVar1;
  if (0 < lVar5) {
    lVar4 = 0;
    do {
      if (cur->nodeTab[lVar4] == val) {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  if (cur->nodeMax == 0) {
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar2;
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      ppxVar2[8] = (xmlNodePtr)0x0;
      ppxVar2[9] = (xmlNodePtr)0x0;
      ppxVar2[6] = (xmlNodePtr)0x0;
      ppxVar2[7] = (xmlNodePtr)0x0;
      ppxVar2[4] = (xmlNodePtr)0x0;
      ppxVar2[5] = (xmlNodePtr)0x0;
      ppxVar2[2] = (xmlNodePtr)0x0;
      ppxVar2[3] = (xmlNodePtr)0x0;
      *ppxVar2 = (xmlNodePtr)0x0;
      ppxVar2[1] = (xmlNodePtr)0x0;
      cur->nodeMax = 10;
      goto LAB_001d6c76;
    }
  }
  else {
    if (iVar1 != cur->nodeMax) {
LAB_001d6c76:
      if (val->type == XML_NAMESPACE_DECL) {
        pxVar3 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
        iVar1 = cur->nodeNr;
        cur->nodeNr = iVar1 + 1;
        cur->nodeTab[iVar1] = pxVar3;
      }
      else {
        iVar1 = cur->nodeNr;
        cur->nodeNr = iVar1 + 1;
        cur->nodeTab[iVar1] = val;
      }
      return 0;
    }
    if (9999999 < iVar1) {
      extra = "growing nodeset hit limit\n";
      goto LAB_001d6cb7;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,lVar5 << 4);
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      cur->nodeMax = cur->nodeMax << 1;
      cur->nodeTab = ppxVar2;
      goto LAB_001d6c76;
    }
  }
  extra = "growing nodeset\n";
LAB_001d6cb7:
  xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
  return -1;
}

Assistant:

int
xmlXPathNodeSetAdd(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) return(0);

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;

        /* TODO: Check memory error. */
	cur->nodeTab[cur->nodeNr++] =
	    xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}